

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

int divsufsortxx::substring::compare_last<char*,bitmap::BitmapArray<long>::iterator>
              (char *T,iterator p1,iterator p2,value_type depth,value_type size)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BitmapArray<long> *pBVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  pBVar3 = p2.array_;
  iVar1 = (*((p1.array_)->super_Bitmap)._vptr_Bitmap[5])(p1.array_,p1.pos_);
  pcVar5 = T + CONCAT44(extraout_var,iVar1) + depth;
  iVar1 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,p2.pos_);
  iVar2 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,p2.pos_ + 1);
  pcVar4 = T + CONCAT44(extraout_var_01,iVar2) + 2;
  for (pcVar6 = T + CONCAT44(extraout_var_00,iVar1) + depth;
      (pcVar5 < T + size && (pcVar6 < pcVar4)); pcVar6 = pcVar6 + 1) {
    if (*pcVar5 != *pcVar6) goto LAB_00109901;
    pcVar5 = pcVar5 + 1;
  }
  if (pcVar5 < T + size) {
    if (pcVar6 < pcVar4) {
LAB_00109901:
      iVar1 = (uint)(*pcVar6 < *pcVar5) * 2 + -1;
    }
    else {
      iVar1 = 1;
    }
  }
  else {
    iVar1 = -(uint)(pcVar6 < pcVar4);
  }
  return iVar1;
}

Assistant:

int compare_last(
    StringIterator_type T, const SAIterator_type p1, const SAIterator_type p2,
    typename std::iterator_traits<SAIterator_type>::value_type depth,
    typename std::iterator_traits<SAIterator_type>::value_type size) {
  StringIterator_type U1 = T + depth + *p1, U2 = T + depth + *p2, U1n = T
      + size, U2n = T + *(p2 + 1) + 2;
  for (; (U1 < U1n) && (U2 < U2n) && (*U1 == *U2); ++U1, ++U2) {
  }

  return U1 < U1n ? (U2 < U2n ? (*U2 < *U1) * 2 - 1 : 1) :
//        (U2 < U2n ? *U1 - *U2 : 1) :
      (U2 < U2n ? -1 : 0);
}